

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave.c
# Opt level: O0

wchar_t lookup_feat(char *name)

{
  int iVar1;
  feature *feat;
  wchar_t i;
  char *name_local;
  
  feat._4_4_ = L'\0';
  while( true ) {
    if (L'\x18' < feat._4_4_) {
      quit_fmt("Failed to find terrain feature %s",name);
      return L'\xffffffff';
    }
    if ((f_info[feat._4_4_].name != (char *)0x0) &&
       (iVar1 = strcmp(name,f_info[feat._4_4_].name), iVar1 == 0)) break;
    feat._4_4_ = feat._4_4_ + L'\x01';
  }
  return feat._4_4_;
}

Assistant:

int lookup_feat(const char *name)
{
	int i;

	/* Look for it */
	for (i = 0; i < FEAT_MAX; i++) {
		struct feature *feat = &f_info[i];
		if (!feat->name)
			continue;

		/* Test for equality */
		if (streq(name, feat->name))
			return i;
	}

	/* Fail horribly */
	quit_fmt("Failed to find terrain feature %s", name);
	return -1;
}